

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_38e3a9::Db::parseUnresolvedName(Db *this)

{
  bool bVar1;
  bool bVar2;
  NameWithTemplateArgs *pNVar3;
  char *pcVar4;
  GlobalQualifiedName *pGVar5;
  QualifiedName *pQVar6;
  StringView S;
  StringView S_00;
  StringView S_01;
  Node *Base;
  NameWithTemplateArgs *local_38;
  NameWithTemplateArgs *local_30;
  
  local_38 = (NameWithTemplateArgs *)0x0;
  S.Last = "";
  S.First = "srN";
  bVar1 = consumeIf(this,S);
  if (bVar1) {
    local_38 = (NameWithTemplateArgs *)parseUnresolvedType(this);
    if (local_38 != (NameWithTemplateArgs *)0x0) {
      if ((this->Last != this->First) && (*this->First == 'I')) {
        local_30 = (NameWithTemplateArgs *)parseTemplateArgs(this,false);
        if (local_30 == (NameWithTemplateArgs *)0x0) {
          return (Node *)0x0;
        }
        local_38 = (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                             ((Db *)this,(Node **)&local_38,(Node **)&local_30);
      }
      while( true ) {
        pcVar4 = this->First;
        if ((pcVar4 != this->Last) && (*pcVar4 == 'E')) goto LAB_0019913f;
        local_30 = (NameWithTemplateArgs *)parseSimpleId(this);
        if (local_30 == (NameWithTemplateArgs *)0x0) break;
        local_38 = (NameWithTemplateArgs *)
                   (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                             ((Db *)this,(Node **)&local_38,(Node **)&local_30);
      }
    }
  }
  else {
    S_00.Last = "";
    S_00.First = "gs";
    bVar1 = consumeIf(this,S_00);
    S_01.Last = "";
    S_01.First = "sr";
    bVar2 = consumeIf(this,S_01);
    if (!bVar2) {
      local_38 = (NameWithTemplateArgs *)parseBaseUnresolvedName(this);
      if (bVar1 && local_38 != (NameWithTemplateArgs *)0x0) {
        pGVar5 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::GlobalQualifiedName,(anonymous_namespace)::Node*&>
                           ((Db *)this,(Node **)&local_38);
        return &pGVar5->super_Node;
      }
      return &local_38->super_Node;
    }
    if ((this->Last == this->First) || (9 < (int)*this->First - 0x30U)) {
      local_38 = (NameWithTemplateArgs *)parseUnresolvedType(this);
      if (local_38 == (NameWithTemplateArgs *)0x0) {
        return (Node *)0x0;
      }
      if ((this->Last != this->First) && (*this->First == 'I')) {
        local_30 = (NameWithTemplateArgs *)parseTemplateArgs(this,false);
        if (local_30 == (NameWithTemplateArgs *)0x0) {
          return (Node *)0x0;
        }
        local_38 = (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                             ((Db *)this,(Node **)&local_38,(Node **)&local_30);
      }
    }
    else {
      bVar2 = true;
      do {
        pNVar3 = (NameWithTemplateArgs *)parseSimpleId(this);
        if (pNVar3 == (NameWithTemplateArgs *)0x0) {
          return (Node *)0x0;
        }
        local_30 = pNVar3;
        if (bVar2) {
          if (bVar1) {
            pNVar3 = (NameWithTemplateArgs *)
                     (anonymous_namespace)::Db::
                     make<(anonymous_namespace)::GlobalQualifiedName,(anonymous_namespace)::Node*&>
                               ((Db *)this,(Node **)&local_30);
          }
        }
        else {
          pNVar3 = (NameWithTemplateArgs *)
                   (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                             ((Db *)this,(Node **)&local_38,(Node **)&local_30);
        }
        pcVar4 = this->First;
        bVar2 = false;
        local_38 = pNVar3;
      } while ((pcVar4 == this->Last) || (bVar2 = false, *pcVar4 != 'E'));
LAB_0019913f:
      this->First = pcVar4 + 1;
    }
    local_30 = (NameWithTemplateArgs *)parseBaseUnresolvedName(this);
    if (local_30 != (NameWithTemplateArgs *)0x0) {
      pQVar6 = (anonymous_namespace)::Db::
               make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                         ((Db *)this,(Node **)&local_38,(Node **)&local_30);
      return &pQVar6->super_Node;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseUnresolvedName() {
  Node *SoFar = nullptr;

  // srN <unresolved-type> [<template-args>] <unresolved-qualifier-level>* E <base-unresolved-name>
  // srN <unresolved-type>                   <unresolved-qualifier-level>+ E <base-unresolved-name>
  if (consumeIf("srN")) {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }

    while (!consumeIf('E')) {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      SoFar = make<QualifiedName>(SoFar, Qual);
    }

    Node *Base = parseBaseUnresolvedName();
    if (Base == nullptr)
      return nullptr;
    return make<QualifiedName>(SoFar, Base);
  }

  bool Global = consumeIf("gs");

  // [gs] <base-unresolved-name>                     # x or (with "gs") ::x
  if (!consumeIf("sr")) {
    SoFar = parseBaseUnresolvedName();
    if (SoFar == nullptr)
      return nullptr;
    if (Global)
      SoFar = make<GlobalQualifiedName>(SoFar);
    return SoFar;
  }

  // [gs] sr <unresolved-qualifier-level>+ E   <base-unresolved-name>
  if (std::isdigit(look())) {
    do {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      if (SoFar)
        SoFar = make<QualifiedName>(SoFar, Qual);
      else if (Global)
        SoFar = make<GlobalQualifiedName>(Qual);
      else
        SoFar = Qual;
    } while (!consumeIf('E'));
  }
  //      sr <unresolved-type>                 <base-unresolved-name>
  //      sr <unresolved-type> <template-args> <base-unresolved-name>
  else {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }
  }

  assert(SoFar != nullptr);

  Node *Base = parseBaseUnresolvedName();
  if (Base == nullptr)
    return nullptr;
  return make<QualifiedName>(SoFar, Base);
}